

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Select * sqlite3SelectNew(Parse *pParse,ExprList *pEList,SrcList *pSrc,Expr *pWhere,
                         ExprList *pGroupBy,Expr *pHaving,ExprList *pOrderBy,u32 selFlags,
                         Expr *pLimit)

{
  Window *pWVar1;
  Expr *pExpr;
  int iVar2;
  undefined1 local_c0 [8];
  Select standin;
  Select *pNew;
  Expr *pHaving_local;
  ExprList *pGroupBy_local;
  Expr *pWhere_local;
  SrcList *pSrc_local;
  ExprList *pEList_local;
  Parse *pParse_local;
  
  standin.pWinDefn = (Window *)sqlite3DbMallocRawNN(pParse->db,0x80);
  if (standin.pWinDefn == (Window *)0x0) {
    standin.pWinDefn = (Window *)local_c0;
  }
  pSrc_local = (SrcList *)pEList;
  if (pEList == (ExprList *)0x0) {
    pExpr = sqlite3Expr(pParse->db,0xac,(char *)0x0);
    pSrc_local = (SrcList *)sqlite3ExprListAppend(pParse,(ExprList *)0x0,pExpr);
  }
  (standin.pWinDefn)->zName = (char *)pSrc_local;
  *(undefined1 *)&(standin.pWinDefn)->zBase = 0x83;
  *(u32 *)((long)&(standin.pWinDefn)->zBase + 4) = selFlags;
  *(undefined4 *)&(standin.pWinDefn)->pPartition = 0;
  *(undefined4 *)((long)&(standin.pWinDefn)->pPartition + 4) = 0;
  iVar2 = pParse->nSelect + 1;
  pParse->nSelect = iVar2;
  *(int *)&(standin.pWinDefn)->pOrderBy = iVar2;
  *(undefined4 *)((long)&(standin.pWinDefn)->pOrderBy + 4) = 0xffffffff;
  pWVar1 = standin.pWinDefn;
  pWVar1->eFrmType = 0xff;
  pWVar1->eStart = 0xff;
  pWVar1->eEnd = 0xff;
  pWVar1->bImplicitFrame = 0xff;
  *(undefined2 *)((long)&(standin.pWinDefn)->zBase + 2) = 0;
  pWhere_local = (Expr *)pSrc;
  if (pSrc == (SrcList *)0x0) {
    pWhere_local = (Expr *)sqlite3DbMallocZero(pParse->db,0x78);
  }
  (standin.pWinDefn)->pStart = pWhere_local;
  (standin.pWinDefn)->pEnd = pWhere;
  (standin.pWinDefn)->pNextWin = (Window *)pGroupBy;
  (standin.pWinDefn)->pFilter = pHaving;
  (standin.pWinDefn)->pFunc = (FuncDef *)pOrderBy;
  pWVar1 = standin.pWinDefn;
  pWVar1->iEphCsr = 0;
  pWVar1->regAccum = 0;
  pWVar1 = standin.pWinDefn;
  pWVar1->regResult = 0;
  pWVar1->csrApp = 0;
  *(Expr **)&(standin.pWinDefn)->regApp = pLimit;
  (standin.pWinDefn)->pOwner = (Expr *)0x0;
  pWVar1 = standin.pWinDefn;
  pWVar1->nBufferCol = 0;
  pWVar1->iArgCol = 0;
  pWVar1 = standin.pWinDefn;
  pWVar1->regOne = 0;
  pWVar1->regStartRowid = 0;
  if (pParse->db->mallocFailed != '\0') {
    clearSelect(pParse->db,(Select *)standin.pWinDefn,(uint)(standin.pWinDefn != (Window *)local_c0)
               );
    standin.pWinDefn = (Window *)0x0;
  }
  return (Select *)standin.pWinDefn;
}

Assistant:

SQLITE_PRIVATE Select *sqlite3SelectNew(
  Parse *pParse,        /* Parsing context */
  ExprList *pEList,     /* which columns to include in the result */
  SrcList *pSrc,        /* the FROM clause -- which tables to scan */
  Expr *pWhere,         /* the WHERE clause */
  ExprList *pGroupBy,   /* the GROUP BY clause */
  Expr *pHaving,        /* the HAVING clause */
  ExprList *pOrderBy,   /* the ORDER BY clause */
  u32 selFlags,         /* Flag parameters, such as SF_Distinct */
  Expr *pLimit          /* LIMIT value.  NULL means not used */
){
  Select *pNew;
  Select standin;
  pNew = sqlite3DbMallocRawNN(pParse->db, sizeof(*pNew) );
  if( pNew==0 ){
    assert( pParse->db->mallocFailed );
    pNew = &standin;
  }
  if( pEList==0 ){
    pEList = sqlite3ExprListAppend(pParse, 0,
                                   sqlite3Expr(pParse->db,TK_ASTERISK,0));
  }
  pNew->pEList = pEList;
  pNew->op = TK_SELECT;
  pNew->selFlags = selFlags;
  pNew->iLimit = 0;
  pNew->iOffset = 0;
  pNew->selId = ++pParse->nSelect;
  pNew->addrOpenEphm[0] = -1;
  pNew->addrOpenEphm[1] = -1;
  pNew->nSelectRow = 0;
  if( pSrc==0 ) pSrc = sqlite3DbMallocZero(pParse->db, sizeof(*pSrc));
  pNew->pSrc = pSrc;
  pNew->pWhere = pWhere;
  pNew->pGroupBy = pGroupBy;
  pNew->pHaving = pHaving;
  pNew->pOrderBy = pOrderBy;
  pNew->pPrior = 0;
  pNew->pNext = 0;
  pNew->pLimit = pLimit;
  pNew->pWith = 0;
#ifndef SQLITE_OMIT_WINDOWFUNC
  pNew->pWin = 0;
  pNew->pWinDefn = 0;
#endif
  if( pParse->db->mallocFailed ) {
    clearSelect(pParse->db, pNew, pNew!=&standin);
    pNew = 0;
  }else{
    assert( pNew->pSrc!=0 || pParse->nErr>0 );
  }
  assert( pNew!=&standin );
  return pNew;
}